

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O1

void __thiscall libmatroska::KaxBlockVirtual::KaxBlockVirtual(KaxBlockVirtual *this)

{
  libebml::EbmlBinary::EbmlBinary(&this->super_EbmlBinary);
  (this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement =
       (_func_int **)&PTR__KaxBlockVirtual_001ce510;
  this->ParentCluster = (KaxCluster *)0x0;
  (this->super_EbmlBinary).Data = this->DataBlock;
  (this->super_EbmlBinary).super_EbmlElement.Size = 5;
  (this->super_EbmlBinary).super_EbmlElement.bValueIsSet = false;
  return;
}

Assistant:

KaxBlockVirtual::KaxBlockVirtual(EBML_EXTRA_DEF)
  :EBML_DEF_BINARY(KaxBlockVirtual)EBML_DEF_SEP ParentCluster(NULL)
{
  SetBuffer(DataBlock,sizeof(DataBlock));
  SetValueIsSet(false);
}